

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int isAlterableTable(Parse *pParse,Table *pTab)

{
  sqlite3 *psVar1;
  long lVar2;
  uchar uVar3;
  ulong uVar4;
  uchar uVar5;
  
  if (pTab->zName == (char *)0x0) {
LAB_001ae136:
    if (-1 < (short)pTab->tabFlags) {
      if ((pTab->tabFlags >> 0xc & 1) == 0) {
        return 0;
      }
      psVar1 = pParse->db;
      if ((psVar1->flags & 0x10000000) == 0) {
        return 0;
      }
      if (psVar1->pVtabCtx != (VtabCtx *)0x0) {
        return 0;
      }
      if (psVar1->nVdbeExec != 0) {
        return 0;
      }
      if ((0 < psVar1->nVTrans) && (psVar1->aVTrans == (VTable **)0x0)) {
        return 0;
      }
    }
  }
  else {
    lVar2 = 0;
    do {
      uVar4 = (ulong)(byte)pTab->zName[lVar2];
      if (uVar4 == 0) {
        uVar5 = ""[(byte)"sqlite_"[lVar2]];
        uVar3 = '\0';
LAB_001ae12d:
        if (uVar3 != uVar5) goto LAB_001ae136;
        break;
      }
      uVar3 = ""[uVar4];
      uVar5 = ""[(byte)"sqlite_"[lVar2]];
      if (uVar3 != uVar5) goto LAB_001ae12d;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 7);
  }
  sqlite3ErrorMsg(pParse,"table %s may not be altered");
  return 1;
}

Assistant:

static int isAlterableTable(Parse *pParse, Table *pTab){
  if( 0==sqlite3StrNICmp(pTab->zName, "sqlite_", 7)
#ifndef SQLITE_OMIT_VIRTUALTABLE
   || (pTab->tabFlags & TF_Eponymous)!=0
   || ( (pTab->tabFlags & TF_Shadow)!=0
        && sqlite3ReadOnlyShadowTables(pParse->db)
   )
#endif
  ){
    sqlite3ErrorMsg(pParse, "table %s may not be altered", pTab->zName);
    return 1;
  }
  return 0;
}